

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator<char> local_5a9;
  undefined1 local_5a8 [8];
  string message;
  undefined1 local_568 [8];
  ostringstream e_2;
  bool local_3e9;
  undefined1 local_3e8 [7];
  bool removed;
  string emsg;
  cmFileTimes ft;
  undefined1 local_3b8 [7];
  bool success;
  undefined1 local_398 [8];
  ostringstream e_1;
  allocator<char> local_219;
  string local_218;
  undefined4 local_1f4;
  string local_1f0;
  undefined1 local_1d0 [8];
  ostringstream e;
  uint local_48;
  uint i;
  Doing doing;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&i);
  bVar2 = false;
  local_48 = 1;
  do {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)file.field_2._8_8_);
    if (sVar3 <= local_48) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        bVar2 = cmsys::SystemTools::FileExists((string *)&i,true);
        if (bVar2) {
          cmFileTimes::cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8),(string *)&i);
          std::__cxx11::string::string((string *)local_3e8);
          bVar2 = cmSystemTools::RemoveRPath((string *)&i,(string *)local_3e8,&local_3e9);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
            poVar5 = std::operator<<((ostream *)local_568,
                                     "RPATH_REMOVE could not remove RPATH from file:\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&i);
            poVar5 = std::operator<<(poVar5,"\n");
            std::operator<<(poVar5,(string *)local_3e8);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
            std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
          }
          ft.times._M_t.
          super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
          super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
          super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_ = bVar2;
          if (ft.times._M_t.
              super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
              _M_t.
              super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
              .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_) {
            if ((local_3e9 & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_5a8,"Removed runtime path from \"",&local_5a9);
              std::allocator<char>::~allocator(&local_5a9);
              std::__cxx11::string::operator+=((string *)local_5a8,(string *)&i);
              std::__cxx11::string::operator+=((string *)local_5a8,"\"");
              cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_5a8,-1.0);
              std::__cxx11::string::~string((string *)local_5a8);
            }
            cmFileTimes::Store((cmFileTimes *)((long)&emsg.field_2 + 8),(string *)&i);
          }
          this_local._7_1_ =
               ft.times._M_t.
               super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
               .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_;
          local_1f4 = 1;
          std::__cxx11::string::~string((string *)local_3e8);
          cmFileTimes::~cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8));
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
          poVar5 = std::operator<<((ostream *)local_398,"RPATH_REMOVE given FILE \"");
          poVar5 = std::operator<<(poVar5,(string *)&i);
          std::operator<<(poVar5,"\" that does not exist.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3b8);
          std::__cxx11::string::~string((string *)local_3b8);
          this_local._7_1_ = false;
          local_1f4 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"RPATH_REMOVE not given FILE option.",&local_219);
        cmCommand::SetError(&this->super_cmCommand,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator(&local_219);
        this_local._7_1_ = false;
        local_1f4 = 1;
      }
LAB_001f153a:
      std::__cxx11::string::~string((string *)&i);
      return this_local._7_1_;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)file.field_2._8_8_,(ulong)local_48);
    bVar1 = std::operator==(pvVar4,"FILE");
    if (bVar1) {
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        poVar5 = std::operator<<((ostream *)local_1d0,"RPATH_REMOVE given unknown argument ");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)file.field_2._8_8_,(ulong)local_48);
        std::operator<<(poVar5,(string *)pvVar4);
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        this_local._7_1_ = false;
        local_1f4 = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        goto LAB_001f153a;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file.field_2._8_8_,(ulong)local_48);
      std::__cxx11::string::operator=((string *)&i,(string *)pvVar4);
      bVar2 = false;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathRemoveCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  enum Doing
  {
    DoingNone,
    DoingFile
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_REMOVE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_REMOVE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_REMOVE could not remove RPATH from file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message = "Removed runtime path from \"";
      message += file;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}